

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               ImGuiSliderFlags flags)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined1 *puVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined1 in_ZMM4 [64];
  float local_78;
  float local_68;
  undefined8 local_38;
  undefined1 extraout_var [60];
  
  pIVar4 = GImGui;
  auVar20 = in_ZMM4._4_12_;
  auVar17._4_60_ = in_register_00001204;
  auVar17._0_4_ = v_speed;
  auVar17 = ZEXT1664(auVar17._0_16_);
  uVar6 = data_type & 0xfffffffe;
  uVar12 = v_max - v_min;
  puVar9 = (undefined1 *)((ulong)(uint3)(v_max >> 8) << 8);
  if (v_speed == 0.0 && (v_min <= v_max && uVar12 != 0)) {
    auVar17 = ZEXT464((uint)((float)uVar12 * GImGui->DragSpeedDefaultRatio));
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  auVar14 = auVar17._0_16_;
  auVar18 = auVar17;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    auVar18 = ZEXT1664(auVar14);
    if (!bVar5) goto LAB_001802be;
    bVar5 = IsMouseDragPastThreshold(0,(pIVar4->IO).MouseDragThreshold * 0.5);
    auVar18 = ZEXT1664(auVar14);
    fVar16 = auVar17._0_4_;
    if (!bVar5) goto LAB_001802be;
    fVar13 = (pIVar4->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar4->IO).KeyAlt != false) {
      fVar13 = fVar13 * 0.01;
    }
    if ((pIVar4->IO).KeyShift != false) {
      fVar13 = fVar13 * 10.0;
    }
  }
  else {
LAB_001802be:
    fVar16 = auVar18._0_4_;
    fVar13 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar8 = 0;
      if (uVar6 == 8) {
        uVar8 = ImParseFormatPrecision(format,3);
      }
      auVar18._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar18._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar18._0_16_);
      fVar13 = *(float *)((long)&local_38 + (ulong)uVar10 * 4);
      if ((int)uVar8 < 0) {
        auVar19 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar8 < 10) {
        puVar9 = GetMinimumStepAtDecimalPrecision(int)::min_steps;
        auVar19 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar8 * 4));
      }
      else {
        auVar15._0_4_ = powf(10.0,(float)(int)-uVar8);
        auVar15._4_60_ = extraout_var;
        auVar19 = auVar15._0_16_;
      }
      auVar1 = vcmpss_avx(auVar19,auVar14,2);
      auVar14 = vblendvps_avx(auVar19,auVar14,auVar1);
      fVar16 = auVar14._0_4_;
    }
  }
  bVar11 = uVar6 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar13 = fVar13 * fVar16;
  if ((flags & 0x100000U) != 0) {
    fVar13 = -fVar13;
  }
  fVar16 = fVar13;
  if (bVar11 != 0) {
    fVar16 = fVar13 / (float)uVar12;
  }
  bVar5 = false;
  if (v_max == v_min) {
    fVar16 = fVar13;
  }
  uVar12 = (uint)CONCAT71((int7)((ulong)puVar9 >> 8),pIVar4->ActiveIdIsJustActivated);
  if ((v_min < v_max) && ((*v < v_max || (bVar5 = true, fVar16 <= 0.0)))) {
    bVar5 = fVar16 < 0.0 && *v <= v_min;
  }
  if ((pIVar4->ActiveIdIsJustActivated != false) || (bVar5)) {
    pIVar4->DragCurrentAccum = 0.0;
    bVar5 = false;
  }
  else {
    if ((fVar16 == 0.0) && (!NAN(fVar16))) goto LAB_0018042b;
    pIVar4->DragCurrentAccum = fVar16 + pIVar4->DragCurrentAccum;
    bVar5 = true;
  }
  pIVar4->DragCurrentAccumDirty = bVar5;
LAB_0018042b:
  if (pIVar4->DragCurrentAccumDirty == true) {
    uVar10 = *v;
    uVar8 = v_min;
    if (bVar11 == 0) {
      local_78 = 0.0;
      local_68 = 0.0;
      uVar8 = uVar10 + (int)pIVar4->DragCurrentAccum;
    }
    else {
      iVar7 = ImParseFormatPrecision(format,3);
      local_68 = powf(0.1,(float)iVar7);
      uVar12 = v_max;
      local_78 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar10,v_min,v_max,true,local_68,0.0);
      if (((v_max != v_min) && (fVar13 = local_78 + pIVar4->DragCurrentAccum, 0.0 < fVar13)) &&
         (uVar8 = v_max, fVar13 < 1.0)) {
        auVar14._0_4_ = (float)v_min;
        auVar14._4_12_ = auVar20;
        auVar19._0_4_ = (float)v_max;
        auVar19._4_12_ = auVar20;
        auVar14 = vmaxss_avx(ZEXT416((uint)local_68),auVar14);
        fVar2 = auVar14._0_4_;
        auVar14 = vmaxss_avx(ZEXT416((uint)local_68),auVar19);
        fVar3 = auVar14._0_4_;
        if (v_max < v_min) {
          fVar13 = 1.0 - fVar13;
          fVar3 = fVar2;
          fVar2 = auVar14._0_4_;
        }
        fVar13 = powf(fVar3 / fVar2,fVar13);
        uVar8 = (uint)(long)(fVar13 * fVar2);
      }
    }
    if ((flags & 0x40U) == 0) {
      uVar8 = RoundScalarWithFormatT<unsigned_int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,uVar8,uVar12);
    }
    pIVar4->DragCurrentAccumDirty = false;
    if (bVar11 == 0) {
      fVar13 = (float)(int)(uVar8 - *v);
    }
    else {
      fVar13 = ScaleRatioFromValueT<unsigned_int,int,float>
                         (data_type,uVar8,v_min,v_max,true,local_68,0.0);
      fVar13 = fVar13 - local_78;
    }
    pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - fVar13;
    uVar12 = *v;
    if ((v_min < v_max) && (uVar12 != uVar8)) {
      if ((uVar8 < v_min) || (((uVar6 != 8 && (uVar12 < uVar8)) && (fVar16 < 0.0)))) {
        uVar8 = v_min;
      }
      if ((v_max < uVar8) || (((uVar6 != 8 && (uVar8 < uVar12)) && (0.0 < fVar16)))) {
        uVar8 = v_max;
      }
    }
    bVar5 = uVar12 != uVar8;
    if (bVar5) {
      *v = uVar8;
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}